

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::LoadBlockIndex(BlockManager *this,optional<uint256> *snapshot_blockhash)

{
  uint uVar1;
  uint64_t uVar2;
  Notifications *pNVar3;
  string_view source_file;
  string_view source_file_00;
  function<CBlockIndex_*(const_uint256_&)> insertBlockIndex;
  CBlockIndex *pCVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  optional<AssumeutxoData> *poVar9;
  CBlockIndex *pCVar10;
  Logger *pLVar11;
  ulong uVar12;
  char cVar13;
  uint uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer ppCVar15;
  char *pcVar16;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  int local_1bc;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  CBlockIndex *pindex;
  bilingual_str local_170;
  string log_msg;
  optional<AssumeutxoData> maybe_au_data;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vSortedByHeight;
  string local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  local_1b8._8_8_ = 0;
  local_1a0 = std::
              _Function_handler<CBlockIndex_*(const_uint256_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp:400:29)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<CBlockIndex_*(const_uint256_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp:400:29)>
              ::_M_manager;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->m_interrupt;
  insertBlockIndex.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffe00;
  insertBlockIndex.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_fffffffffffffdf8;
  insertBlockIndex.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffe08;
  insertBlockIndex._M_invoker._0_4_ = in_stack_fffffffffffffe10;
  insertBlockIndex._M_invoker._4_4_ = in_stack_fffffffffffffe14;
  local_1b8._M_unused._M_object = this;
  bVar5 = kernel::BlockTreeDB::LoadBlockIndexGuts
                    ((this->m_block_tree_db)._M_t.
                     super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                     .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,
                     &((this->m_opts).chainparams)->consensus,insertBlockIndex,
                     (SignalInterrupt *)&local_1b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  if (bVar5) {
    cVar6 = (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
            super__Optional_payload_base<uint256>._M_engaged;
    if ((bool)cVar6 == true) {
      FindFirst<AssumeutxoData,CChainParams::AssumeutxoForBlockhash(uint256_const&)const::_lambda(auto:1_const&)_1_>
                (&maybe_au_data,&((this->m_opts).chainparams)->m_assumeutxo_data,
                 (anon_class_8_1_49a1fdbb)snapshot_blockhash);
      if (maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
          super__Optional_payload_base<AssumeutxoData>._M_engaged == false) {
        pNVar3 = (this->m_opts).notifications;
        _(&local_170,(ConstevalStringLiteral)0xcb2f05);
        base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)snapshot_blockhash);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)&log_msg,(tinyformat *)&local_170,(bilingual_str *)&local_58,
                   args);
        (*pNVar3->_vptr_Notifications[8])(pNVar3,&log_msg);
        bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
        std::__cxx11::string::~string((string *)&local_58);
        bilingual_str::~bilingual_str(&local_170);
        goto LAB_0076003b;
      }
      pcVar16 = "maybe_au_data";
      poVar9 = inline_assertion_check<true,std::optional<AssumeutxoData>const&>
                         (&maybe_au_data,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                          ,0x19a,"LoadBlockIndex","maybe_au_data");
      (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> =
           (_Optional_payload_base<int>)
           ((ulong)(uint)(poVar9->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
                         super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.height |
           0x100000000);
      pCVar10 = LookupBlockIndex(this,(uint256 *)snapshot_blockhash);
      pCVar10->m_chain_tx_count =
           (poVar9->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
           super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.m_chain_tx_count;
      base_blob<256u>::ToString_abi_cxx11_((string *)&pindex,(base_blob<256u> *)snapshot_blockhash);
      pLVar11 = LogInstance();
      bVar5 = BCLog::Logger::Enabled(pLVar11);
      if (bVar5) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<unsigned_long,std::__cxx11::string>
                  (&local_170.original,(tinyformat *)"[snapshot] set m_chain_tx_count=%d for %s\n",
                   (char *)&(poVar9->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
                            super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.
                            m_chain_tx_count,(unsigned_long *)&pindex,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar16);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_170.original);
        std::__cxx11::string::~string((string *)&local_170);
        pLVar11 = LogInstance();
        local_170.original._M_dataplus._M_p = (pointer)0x5e;
        local_170.original._M_string_length = 0xcb2cf4;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "LoadBlockIndex";
        logging_function._M_len = 0xe;
        BCLog::Logger::LogPrintStr(pLVar11,str,logging_function,source_file,0x1a2,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)&pindex);
      cVar13 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged;
      cVar6 = (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
              super__Optional_payload_base<uint256>._M_engaged;
    }
    else {
      cVar13 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged;
      if ((bool)cVar13 == true) {
        (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged = false;
        cVar13 = '\0';
      }
    }
    maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
    super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.height._0_1_ = cVar13 == cVar6;
    pcVar16 = "m_snapshot_height.has_value() == snapshot_blockhash.has_value()";
    inline_assertion_check<true,bool>
              ((bool *)&maybe_au_data,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
               ,0x1aa,"LoadBlockIndex",
               "m_snapshot_height.has_value() == snapshot_blockhash.has_value()");
    GetAllBlockIndices(&vSortedByHeight,this);
    std::
    __sort<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,__gnu_cxx::__ops::_Iter_comp_iter<node::CBlockIndexHeightOnlyComparator>>
              (vSortedByHeight.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
               _M_impl.super__Vector_impl_data._M_start,
               vSortedByHeight.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    pCVar10 = (CBlockIndex *)0x0;
    for (ppCVar15 = vSortedByHeight.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        bVar5 = ppCVar15 ==
                vSortedByHeight.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, !bVar5; ppCVar15 = ppCVar15 + 1) {
      pindex = *ppCVar15;
      bVar7 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
      pCVar4 = pindex;
      if (bVar7) break;
      if ((pCVar10 != (CBlockIndex *)0x0) && (iVar8 = pCVar10->nHeight + 1, iVar8 < pindex->nHeight)
         ) {
        local_1bc = iVar8;
        pLVar11 = LogInstance();
        bVar7 = BCLog::Logger::Enabled(pLVar11);
        if (bVar7) {
          maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
          super__Optional_payload_base<AssumeutxoData>._M_payload._0_8_ =
               (long)&maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
                      super__Optional_payload_base<AssumeutxoData>._M_payload + 0x10;
          maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
          super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ = 0;
          maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
          super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.hash_serialized.
          super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          tinyformat::format<char[15],int>
                    (&log_msg,(tinyformat *)
                              "%s: block index is non-contiguous, index of height %d missing\n",
                     "LoadBlockIndex",(char (*) [15])&local_1bc,(int *)pcVar16);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &maybe_au_data,&log_msg);
          std::__cxx11::string::~string((string *)&log_msg);
          pLVar11 = LogInstance();
          log_msg._M_dataplus._M_p = (pointer)0x5e;
          log_msg._M_string_length = (size_type)anon_var_dwarf_2376cc2;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
          ;
          source_file_00._M_len = 0x5e;
          str_00._M_str =
               (char *)maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
                       super__Optional_payload_base<AssumeutxoData>._M_payload._0_8_;
          str_00._M_len =
               maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
               super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_;
          logging_function_00._M_str = "LoadBlockIndex";
          logging_function_00._M_len = 0xe;
          BCLog::Logger::LogPrintStr
                    (pLVar11,str_00,logging_function_00,source_file_00,0x1b5,ALL,Error);
          std::__cxx11::string::~string((string *)&maybe_au_data);
        }
        break;
      }
      if (pindex->pprev == (CBlockIndex *)0x0) {
        base_uint<256U>::base_uint((base_uint<256U> *)&local_170,0);
      }
      else {
        base_uint<256U>::base_uint
                  ((base_uint<256U> *)&local_170,&(pindex->pprev->nChainWork).super_base_uint<256U>)
        ;
      }
      GetBlockProof((arith_uint256 *)&local_58,pindex);
      ::operator+((base_uint<256U> *)&log_msg,(base_uint<256U> *)&local_170,
                  (base_uint<256U> *)&local_58);
      base_uint<256U>::base_uint((base_uint<256U> *)&maybe_au_data,(base_uint<256U> *)&log_msg);
      base_uint<256U>::operator=
                (&(pindex->nChainWork).super_base_uint<256U>,(base_uint<256U> *)&maybe_au_data);
      if (pindex->pprev == (CBlockIndex *)0x0) {
        uVar12 = (ulong)pindex->nTx;
        pindex->nTimeMax = pindex->nTime;
        if (uVar12 != 0) {
LAB_0075ff3f:
          pindex->m_chain_tx_count = uVar12;
        }
      }
      else {
        uVar1 = pindex->pprev->nTimeMax;
        uVar14 = pindex->nTime;
        if (pindex->nTime < uVar1) {
          uVar14 = uVar1;
        }
        pindex->nTimeMax = uVar14;
        if (pindex->nTx != 0) {
          if (((this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged == true) &&
             (pindex->nHeight ==
              (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>._M_payload._M_value)) {
            CBlockIndex::GetBlockHash((uint256 *)&maybe_au_data,pindex);
            bVar5 = ::operator==((base_blob<256U> *)&maybe_au_data,
                                 (base_blob<256U> *)snapshot_blockhash);
            if (bVar5) {
              maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
              super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.height._0_1_ =
                   pindex->m_chain_tx_count != 0;
              pcVar16 = "pindex->m_chain_tx_count > 0";
              inline_assertion_check<true,bool>
                        ((bool *)&maybe_au_data,
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                         ,0x1c5,"LoadBlockIndex","pindex->m_chain_tx_count > 0");
              goto LAB_0075ff6c;
            }
          }
          uVar2 = pindex->pprev->m_chain_tx_count;
          if (uVar2 != 0) {
            uVar12 = uVar2 + pindex->nTx;
            goto LAB_0075ff3f;
          }
          pindex->m_chain_tx_count = 0;
          maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
          super__Optional_payload_base<AssumeutxoData>._M_payload._0_8_ = pindex->pprev;
          maybe_au_data.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
          super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ = pindex;
          std::
          _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
          ::_M_emplace_equal<std::pair<CBlockIndex*,CBlockIndex*>>
                    ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                      *)&this->m_blocks_unlinked,
                     (pair<CBlockIndex_*,_CBlockIndex_*> *)&maybe_au_data);
        }
      }
LAB_0075ff6c:
      if ((((pindex->nStatus & 0x60) == 0) && (pindex->pprev != (CBlockIndex *)0x0)) &&
         ((pindex->pprev->nStatus & 0x60) != 0)) {
        pindex->nStatus = pindex->nStatus | 0x40;
        std::
        _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
        ::_M_insert_unique<CBlockIndex*const&>
                  ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    *)&this->m_dirty_blockindex,&pindex);
      }
      if (pindex->pprev != (CBlockIndex *)0x0) {
        CBlockIndex::BuildSkip(pindex);
      }
      pCVar10 = pCVar4;
    }
    std::_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Vector_base
              (&vSortedByHeight.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>);
  }
  else {
LAB_0076003b:
    bVar5 = false;
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_38._M_p) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool BlockManager::LoadBlockIndex(const std::optional<uint256>& snapshot_blockhash)
{
    if (!m_block_tree_db->LoadBlockIndexGuts(
            GetConsensus(), [this](const uint256& hash) EXCLUSIVE_LOCKS_REQUIRED(cs_main) { return this->InsertBlockIndex(hash); }, m_interrupt)) {
        return false;
    }

    if (snapshot_blockhash) {
        const std::optional<AssumeutxoData> maybe_au_data = GetParams().AssumeutxoForBlockhash(*snapshot_blockhash);
        if (!maybe_au_data) {
            m_opts.notifications.fatalError(strprintf(_("Assumeutxo data not found for the given blockhash '%s'."), snapshot_blockhash->ToString()));
            return false;
        }
        const AssumeutxoData& au_data = *Assert(maybe_au_data);
        m_snapshot_height = au_data.height;
        CBlockIndex* base{LookupBlockIndex(*snapshot_blockhash)};

        // Since m_chain_tx_count (responsible for estimated progress) isn't persisted
        // to disk, we must bootstrap the value for assumedvalid chainstates
        // from the hardcoded assumeutxo chainparams.
        base->m_chain_tx_count = au_data.m_chain_tx_count;
        LogPrintf("[snapshot] set m_chain_tx_count=%d for %s\n", au_data.m_chain_tx_count, snapshot_blockhash->ToString());
    } else {
        // If this isn't called with a snapshot blockhash, make sure the cached snapshot height
        // is null. This is relevant during snapshot completion, when the blockman may be loaded
        // with a height that then needs to be cleared after the snapshot is fully validated.
        m_snapshot_height.reset();
    }

    Assert(m_snapshot_height.has_value() == snapshot_blockhash.has_value());

    // Calculate nChainWork
    std::vector<CBlockIndex*> vSortedByHeight{GetAllBlockIndices()};
    std::sort(vSortedByHeight.begin(), vSortedByHeight.end(),
              CBlockIndexHeightOnlyComparator());

    CBlockIndex* previous_index{nullptr};
    for (CBlockIndex* pindex : vSortedByHeight) {
        if (m_interrupt) return false;
        if (previous_index && pindex->nHeight > previous_index->nHeight + 1) {
            LogError("%s: block index is non-contiguous, index of height %d missing\n", __func__, previous_index->nHeight + 1);
            return false;
        }
        previous_index = pindex;
        pindex->nChainWork = (pindex->pprev ? pindex->pprev->nChainWork : 0) + GetBlockProof(*pindex);
        pindex->nTimeMax = (pindex->pprev ? std::max(pindex->pprev->nTimeMax, pindex->nTime) : pindex->nTime);

        // We can link the chain of blocks for which we've received transactions at some point, or
        // blocks that are assumed-valid on the basis of snapshot load (see
        // PopulateAndValidateSnapshot()).
        // Pruned nodes may have deleted the block.
        if (pindex->nTx > 0) {
            if (pindex->pprev) {
                if (m_snapshot_height && pindex->nHeight == *m_snapshot_height &&
                        pindex->GetBlockHash() == *snapshot_blockhash) {
                    // Should have been set above; don't disturb it with code below.
                    Assert(pindex->m_chain_tx_count > 0);
                } else if (pindex->pprev->m_chain_tx_count > 0) {
                    pindex->m_chain_tx_count = pindex->pprev->m_chain_tx_count + pindex->nTx;
                } else {
                    pindex->m_chain_tx_count = 0;
                    m_blocks_unlinked.insert(std::make_pair(pindex->pprev, pindex));
                }
            } else {
                pindex->m_chain_tx_count = pindex->nTx;
            }
        }
        if (!(pindex->nStatus & BLOCK_FAILED_MASK) && pindex->pprev && (pindex->pprev->nStatus & BLOCK_FAILED_MASK)) {
            pindex->nStatus |= BLOCK_FAILED_CHILD;
            m_dirty_blockindex.insert(pindex);
        }
        if (pindex->pprev) {
            pindex->BuildSkip();
        }
    }

    return true;
}